

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineLayoutCreateInfo *layout,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint32_t i;
  ulong uVar1;
  uint32_t i_1;
  long lVar2;
  Value set_layouts;
  Value push;
  Data local_e8;
  Data *local_d0;
  Data local_c8;
  Data local_b8;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  Fossilize local_60 [16];
  StringRefType local_50;
  StringRefType local_40;
  
  local_b8.n.i64 = (Number)0x0;
  local_b8.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  local_d0 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_b8.s,&local_40,layout->flags,alloc);
  local_c8.n = (Number)0x0;
  local_c8.s.str = (Ch *)0x4000000000000;
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < layout->pushConstantRangeCount; uVar1 = uVar1 + 1) {
    local_e8.n.i64 = (Number)0x0;
    local_e8.s.str = (Ch *)0x3000000000000;
    local_80.s = "stageFlags";
    local_80.length = 10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_e8.s,&local_80,
               *(uint *)((long)&layout->pPushConstantRanges->stageFlags + lVar2),alloc);
    local_90.s = "size";
    local_90.length = 4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_e8.s,&local_90,*(uint *)((long)&layout->pPushConstantRanges->size + lVar2),
               alloc);
    local_a0.s = "offset";
    local_a0.length = 6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_e8.s,&local_a0,
               *(uint *)((long)&layout->pPushConstantRanges->offset + lVar2),alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_e8.s,alloc);
    lVar2 = lVar2 + 0xc;
  }
  local_50.s = "pushConstantRanges";
  local_50.length = 0x12;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,&local_50,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,alloc);
  local_e8.n = (Number)0x0;
  local_e8.s.str = (Ch *)0x4000000000000;
  for (uVar1 = 0; uVar1 < layout->setLayoutCount; uVar1 = uVar1 + 1) {
    uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              (local_60,(uint64_t)layout->pSetLayouts[uVar1],alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_e8.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_60,alloc);
  }
  local_70.s = "setLayouts";
  local_70.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,&local_70,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_e8.s,alloc);
  if (&local_b8 != local_d0) {
    local_d0->n = local_b8.n;
    (&local_d0->n)[1] = (Number)local_b8.s.str;
  }
  return SUB81(local_d0,0);
}

Assistant:

static bool json_value(const VkPipelineLayoutCreateInfo& layout, Allocator& alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", layout.flags, alloc);
	Value push(kArrayType);
	for (uint32_t i = 0; i < layout.pushConstantRangeCount; i++)
	{
		Value range(kObjectType);
		range.AddMember("stageFlags", layout.pPushConstantRanges[i].stageFlags, alloc);
		range.AddMember("size", layout.pPushConstantRanges[i].size, alloc);
		range.AddMember("offset", layout.pPushConstantRanges[i].offset, alloc);
		push.PushBack(range, alloc);
	}
	p.AddMember("pushConstantRanges", push, alloc);

	Value set_layouts(kArrayType);
	for (uint32_t i = 0; i < layout.setLayoutCount; i++)
		set_layouts.PushBack(uint64_string(api_object_cast<uint64_t>(layout.pSetLayouts[i]), alloc), alloc);
	p.AddMember("setLayouts", set_layouts, alloc);

	*out_value = p;
	return true;
}